

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O0

void k053260_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  UINT32 UVar1;
  DEV_SMPL local_38;
  DEV_SMPL DStack_34;
  UINT16 cycles;
  DEV_SMPL buffer [2];
  UINT32 j;
  UINT32 i;
  k053260_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  if (((*(byte *)((long)param + 0x25) & 2) == 0) || (*(long *)((long)param + 200) == 0)) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
  }
  else {
    for (buffer[0] = 0; (uint)buffer[0] < samples; buffer[0] = buffer[0] + 1) {
      memset(&local_38,0,8);
      RC_STEP((RATIO_CNTR *)((long)param + 0xd8));
      UVar1 = RC_GET_VAL((RATIO_CNTR *)((long)param + 0xd8));
      RC_MASK((RATIO_CNTR *)((long)param + 0xd8));
      for (buffer[1] = 0; (uint)buffer[1] < 4; buffer[1] = buffer[1] + 1) {
        if ((*(char *)((long)param + (ulong)(uint)buffer[1] * 0x28 + 0x3f) != '\0') &&
           (*(char *)((long)param + (ulong)(uint)buffer[1] * 0x28 + 0x4d) == '\0')) {
          KDSC_play((KDSC_Voice *)((long)param + (ulong)(uint)buffer[1] * 0x28 + 0x28),&local_38,
                    (UINT16)UVar1);
        }
      }
      (*outputs)[(uint)buffer[0]] = local_38;
      outputs[1][(uint)buffer[0]] = DStack_34;
    }
  }
  return;
}

Assistant:

static void k053260_update(void* param, UINT32 samples, DEV_SMPL **outputs)
{
	k053260_state *info = (k053260_state *)param;

	if ((info->mode & 2) && info->rom != NULL)
	{
		UINT32 i, j;

		for (j = 0; j < samples; j++)
		{
			DEV_SMPL buffer[2] = {0, 0};
			UINT16 cycles;

			RC_STEP(&info->cycleCntr);
			cycles = (UINT16)RC_GET_VAL(&info->cycleCntr);
			RC_MASK(&info->cycleCntr);

			for ( i = 0; i < 4; i++ )
			{
				if (info->voice[i].playing && !info->voice[i].Muted)
					KDSC_play(&info->voice[i], buffer, cycles);
			}

			outputs[0][j] = buffer[0];
			outputs[1][j] = buffer[1];
		}
	}
	else
	{
		memset( outputs[0], 0, samples * sizeof(*outputs[0]));
		memset( outputs[1], 0, samples * sizeof(*outputs[1]));
	}
}